

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile_sort_tree.hpp
# Opt level: O0

char __thiscall
duckdb::Interpolator<true>::Operation<signed_char,signed_char,duckdb::QuantileDirect<signed_char>>
          (Interpolator<true> *this,char *v_t,Vector *result,QuantileDirect<signed_char> *accessor)

{
  RESULT_TYPE RVar1;
  char cVar2;
  char *in_RCX;
  char *in_stack_00000028;
  Interpolator<true> *in_stack_00000030;
  undefined7 in_stack_ffffffffffffffd8;
  
  RVar1 = InterpolateInternal<signed_char,duckdb::QuantileDirect<signed_char>>
                    (in_stack_00000030,in_stack_00000028,(QuantileDirect<signed_char> *)this);
  cVar2 = CastInterpolation::Cast<signed_char,signed_char>
                    (in_RCX,(Vector *)CONCAT17(RVar1,in_stack_ffffffffffffffd8));
  return cVar2;
}

Assistant:

TARGET_TYPE Operation(INPUT_TYPE *v_t, Vector &result, const ACCESSOR &accessor = ACCESSOR()) const {
		using ACCESS_TYPE = typename ACCESSOR::RESULT_TYPE;
		return CastInterpolation::Cast<ACCESS_TYPE, TARGET_TYPE>(InterpolateInternal(v_t, accessor), result);
	}